

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# STEPFile.h
# Opt level: O3

Object * Assimp::STEP::ObjectHelper<Assimp::IFC::Schema_2x3::IfcAnnotationOccurrence,_0UL>::
         Construct(DB *db,LIST *params)

{
  IfcStyledItem *this;
  
  this = (IfcStyledItem *)operator_new(0x98);
  *(undefined ***)&this->field_0x80 = &PTR__Object_00816a50;
  *(undefined8 *)(this + 1) = 0;
  *(char **)&this[1].field_0x8 = "IfcAnnotationOccurrence";
  Assimp::IFC::Schema_2x3::IfcStyledItem::IfcStyledItem(this,&PTR_construction_vtable_24__008651b8);
  *(undefined ***)this = &PTR__IfcAnnotationOccurrence_00865128;
  *(undefined ***)&this->field_0x80 = &PTR__IfcAnnotationOccurrence_008651a0;
  (this->super_ObjectHelper<Assimp::IFC::Schema_2x3::IfcStyledItem,_3UL>)._vptr_ObjectHelper =
       (_func_int **)&PTR__IfcAnnotationOccurrence_00865150;
  *(undefined ***)&this->field_0x70 = &PTR__IfcAnnotationOccurrence_00865178;
  GenericFill<Assimp::IFC::Schema_2x3::IfcStyledItem>(db,params,this);
  return (Object *)(&this->field_0x0 + *(long *)(*(long *)this + -0x18));
}

Assistant:

static Object* Construct(const STEP::DB& db, const EXPRESS::LIST& params) {
            // make sure we don't leak if Fill() throws an exception
            std::unique_ptr<TDerived> impl(new TDerived());

            // GenericFill<T> is undefined so we need to have a specialization
            const size_t num_args = GenericFill<TDerived>(db,params,&*impl);
            (void)num_args;

            // the following check is commented because it will always trigger if
            // parts of the entities are generated with dummy wrapper code.
            // This is currently done to reduce the size of the loader
            // code.
            //if (num_args != params.GetSize() && impl->GetClassName() != "NotImplemented") {
            //  DefaultLogger::get()->debug("STEP: not all parameters consumed");
            //}
            return impl.release();
        }